

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O0

void __thiscall duckdb::StringStatisticsState::Update(StringStatisticsState *this,string_t *val)

{
  string_t str;
  bool bVar1;
  idx_t iVar2;
  string *in_RSI;
  string *in_RDI;
  string_t *in_stack_fffffffffffffee8;
  string *right;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined1 uVar3;
  string *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 uVar4;
  idx_t in_stack_ffffffffffffff10;
  StringStatisticsState *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  string_t *in_stack_ffffffffffffff28;
  string local_d0 [32];
  idx_t in_stack_ffffffffffffff50;
  StringStatisticsState *in_stack_ffffffffffffff58;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffff60;
  string local_70 [32];
  undefined8 local_50;
  size_type local_48;
  string local_40 [48];
  string *local_10;
  
  if ((in_RDI->_M_string_length & 0x100000000) == 0) {
    uVar4 = true;
    local_10 = in_RSI;
    if ((in_RDI->_M_string_length & 0x100) != 0) {
      string_t::string_t((string_t *)CONCAT17(1,in_stack_ffffffffffffff00),in_RSI);
      uVar4 = LessThan::Operation<duckdb::string_t>
                        ((string_t *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
      in_stack_fffffffffffffef8 = in_RSI;
    }
    if ((bool)uVar4 != false) {
      iVar2 = string_t::GetSize((string_t *)local_10);
      if (iVar2 < 0x101) {
        string_t::GetString_abi_cxx11_(in_stack_ffffffffffffff28);
        ::std::__cxx11::string::operator=((string *)(in_RDI->field_2)._M_local_buf,local_70);
        ::std::__cxx11::string::~string(local_70);
        *(undefined1 *)((long)&in_RDI->_M_string_length + 2) = 0;
      }
      else {
        local_50 = *(undefined8 *)local_10;
        local_48 = local_10->_M_string_length;
        TruncateMin_abi_cxx11_
                  (in_stack_ffffffffffffff58,(string_t)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff50);
        ::std::__cxx11::string::operator=((string *)(in_RDI->field_2)._M_local_buf,local_40);
        ::std::__cxx11::string::~string(local_40);
        *(undefined1 *)((long)&in_RDI->_M_string_length + 2) = 1;
      }
    }
    uVar3 = true;
    if ((in_RDI->_M_string_length & 0x100) != 0) {
      right = local_10;
      string_t::string_t((string_t *)CONCAT17(uVar4,in_stack_ffffffffffffff00),
                         in_stack_fffffffffffffef8);
      uVar3 = GreaterThan::Operation<duckdb::string_t>
                        ((string_t *)CONCAT17(uVar3,in_stack_fffffffffffffef0),(string_t *)right);
    }
    if ((bool)uVar3 != false) {
      iVar2 = string_t::GetSize((string_t *)local_10);
      if (iVar2 < 0x101) {
        string_t::GetString_abi_cxx11_(in_stack_ffffffffffffff28);
        ::std::__cxx11::string::operator=
                  ((string *)in_RDI[1].field_2._M_local_buf,(string *)&stack0xffffffffffffff10);
        ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
        *(undefined1 *)((long)&in_RDI->_M_string_length + 3) = 0;
      }
      else {
        str.value.pointer.ptr = (char *)in_stack_ffffffffffffff28;
        str.value._0_8_ = in_stack_ffffffffffffff20;
        bVar1 = TryTruncateMax(in_stack_ffffffffffffff18,str,in_stack_ffffffffffffff10,in_RDI);
        if (!bVar1) {
          *(undefined1 *)((long)&in_RDI->_M_string_length + 4) = 1;
          *(undefined1 *)((long)&in_RDI->_M_string_length + 1) = 0;
          ::std::__cxx11::string::string((string *)&stack0xffffffffffffff50);
          ::std::__cxx11::string::operator=
                    ((string *)(in_RDI->field_2)._M_local_buf,(string *)&stack0xffffffffffffff50);
          ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
          ::std::__cxx11::string::string(local_d0);
          ::std::__cxx11::string::operator=((string *)in_RDI[1].field_2._M_local_buf,local_d0);
          ::std::__cxx11::string::~string(local_d0);
          return;
        }
        *(undefined1 *)((long)&in_RDI->_M_string_length + 3) = 1;
      }
    }
    *(undefined1 *)((long)&in_RDI->_M_string_length + 1) = 1;
  }
  return;
}

Assistant:

void Update(const string_t &val) {
		if (failed_truncate) {
			return;
		}
		if (!has_stats || LessThan::Operation(val, string_t(min))) {
			if (val.GetSize() > MAX_STRING_STATISTICS_SIZE) {
				// string value exceeds our max string stats size - truncate
				min = TruncateMin(val, MAX_STRING_STATISTICS_SIZE);
				min_truncated = true;
			} else {
				min = val.GetString();
				min_truncated = false;
			}
		}
		if (!has_stats || GreaterThan::Operation(val, string_t(max))) {
			if (val.GetSize() > MAX_STRING_STATISTICS_SIZE) {
				// string value exceeds our max string stats size - truncate
				if (!TryTruncateMax(val, MAX_STRING_STATISTICS_SIZE, max)) {
					// we failed to truncate - this can happen in some edge cases
					// skip stats for this column
					failed_truncate = true;
					has_stats = false;
					min = string();
					max = string();
					return;
				}
				max_truncated = true;
			} else {
				max = val.GetString();
				max_truncated = false;
			}
		}
		has_stats = true;
	}